

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Token * generate_token(Lexer *lexer,int chr,CharBuff *buff)

{
  int iVar1;
  char *pcVar2;
  Token *pTVar3;
  KindMeta KVar4;
  char *c;
  Kind kind;
  CharBuff *buff_local;
  int chr_local;
  Lexer *lexer_local;
  
  switch(chr) {
  case 0x20:
    break;
  case 0x21:
  case 0x25:
  case 0x26:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x5b:
  case 0x5d:
  case 0x7b:
  case 0x7c:
  case 0x7d:
    unread_chr(lexer,chr);
    pTVar3 = read_operator(lexer,buff);
    return pTVar3;
  case 0x22:
  case 0x27:
    unread_chr(lexer,chr);
    pcVar2 = read_string(lexer,buff);
    pTVar3 = new_token(lexer,0xd2,pcVar2);
    return pTVar3;
  default:
    iVar1 = is_digit(chr);
    if (iVar1 != 0) {
      unread_chr(lexer,chr);
      pcVar2 = read_digit(lexer,buff);
      pTVar3 = new_token(lexer,0xd0,pcVar2);
      return pTVar3;
    }
    iVar1 = is_letter(chr);
    if (((iVar1 != 0) || (iVar1 = is_symbol(chr), iVar1 != 0)) || (chr < 0)) {
      unread_chr(lexer,chr);
      pcVar2 = read_letter(lexer,buff);
      KVar4 = find_kind(pcVar2);
      c._4_4_ = KVar4.kind;
      if (c._4_4_ == EMPTY) {
        c._4_4_ = ID;
      }
      pTVar3 = new_token(lexer,c._4_4_,pcVar2);
      return pTVar3;
    }
    iVar1 = is_new_line(chr);
    if (iVar1 != 0) {
      append_chr(buff,(char)chr);
      pcVar2 = to_string(buff);
      pTVar3 = new_token(lexer,0xd3,pcVar2);
      return pTVar3;
    }
  }
  append_chr(buff,(char)chr);
  pcVar2 = to_string(buff);
  pTVar3 = new_token(lexer,0xd1,pcVar2);
  return pTVar3;
}

Assistant:

Token* generate_token(Lexer* lexer, int chr, CharBuff* buff){
    switch (chr) {
        case ' ':
            break;
        case '+':
        case '-':
        case '*':
        case '/':
        case '&':
        case '|':
        case '!':
        case '(':
        case ')':
        case '{':
        case '}':
        case '%':
        case '[':
        case ']':
        case '>':
        case '<':
        case '=':
        case ',':
        case '.':
        case ':':
        case ';':
            unread_chr(lexer, chr);
            return read_operator(lexer, buff);
        case '\'':
        case '"':
            /**
             *  处理字符串
             */
            unread_chr(lexer, chr);
            return new_token(lexer, CONST_STRING, read_string(lexer, buff));
        default: {
            if (is_digit(chr)) {
                unread_chr(lexer, chr);
                return new_token(lexer, NUMBER, read_digit(lexer, buff));
            } else if (is_letter(chr) || is_symbol(chr) || chr < 0) {
                unread_chr(lexer, chr);
                Kind kind;
                char *c = read_letter(lexer, buff);
                if ((kind = find_kind(c).kind) == EMPTY) {
                    kind = ID;
                }
                return new_token(lexer, kind, c);
            } else if (is_new_line(chr)) {
                append_chr(buff, (char) chr);
                return new_token(lexer, NEWLINE, to_string(buff));
            }
        }
    }
    append_chr(buff, (char)chr);
    return new_token(lexer, EMPTY, to_string(buff));
}